

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sampler.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  string *line_1;
  pointer pbVar2;
  string *line;
  pointer pbVar3;
  long lVar4;
  allocator local_2b9;
  char **local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_lines;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  samples;
  string local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  ofstream ofs;
  
  if (2 < argc) {
    std::__cxx11::string::string((string *)&samples,argv[1],(allocator *)&local_268);
    file_slurp((string *)&ofs,(string *)&samples);
    local_2b8 = argv;
    line_break(&file_lines,(string *)&ofs);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&samples);
    samples._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &samples._M_t._M_impl.super__Rb_tree_header._M_header;
    samples._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    samples._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    samples._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    samples._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         samples._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (lVar4 = 0x18;
        pbVar2 = file_lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, (ulong)(uint)argc << 3 != lVar4;
        lVar4 = lVar4 + 8) {
      std::__cxx11::string::string
                ((string *)&local_268,*(char **)((long)local_2b8 + lVar4),&local_2b9);
      file_slurp((string *)&ofs,&local_268);
      line_break(&local_248,(string *)&ofs);
      find_samples(&local_248,&samples);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_248);
      std::__cxx11::string::~string((string *)&ofs);
      std::__cxx11::string::~string((string *)&local_268);
    }
    for (pbVar3 = file_lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1)
    {
      lVar4 = std::__cxx11::string::find((char *)pbVar3,0x1050b3);
      if (lVar4 != -1) {
        std::__cxx11::string::find((char *)pbVar3,0x1050b3);
        std::__cxx11::string::substr((ulong)&ofs,(ulong)pbVar3);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&samples,(key_type *)&ofs);
        std::__cxx11::string::_M_assign((string *)pbVar3);
        std::__cxx11::string::~string((string *)&ofs);
      }
    }
    std::ofstream::ofstream(&ofs,local_2b8[2],_S_out);
    for (pbVar2 = file_lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 != file_lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      poVar1 = std::operator<<((ostream *)&ofs,(string *)pbVar2);
      std::operator<<(poVar1,"\n");
    }
    std::ofstream::~ofstream(&ofs);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&samples._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&file_lines);
    return 0;
  }
  __assert_fail("3 <= argc",
                "/workspace/llm4binary/github/license_c_cmakelists/tzlaine[P]type_erasure/presentation/code_sampler/code_sampler.cpp"
                ,0x2e,"int main(int, char **)");
}

Assistant:

int main (int argc, char * argv[])
{
    assert(3 <= argc);

    const char * in_filename = argv[1];

    std::vector<std::string> file_lines = line_break(file_slurp(in_filename));

    std::map<std::string, std::string> samples;
    std::for_each(argv + 3, argv + argc,
                  [&](const char * filename) {
                      find_samples(line_break(file_slurp(filename)), samples);
                  });

    for (std::string & line : file_lines) {
        std::string::size_type sample_ref_pos = line.find("%%");
        if (sample_ref_pos != std::string::npos) {
            sample_ref_pos += 2;
            std::string::size_type sample_ref_end_pos =
                line.find("%%", sample_ref_pos);
            const std::string sample_name = line.substr(
                sample_ref_pos,
                sample_ref_end_pos - sample_ref_pos
            );
            line = samples[sample_name];
        }
    }

    const char * out_filename = argv[2];
    std::ofstream ofs(out_filename);
    for (const std::string & line : file_lines) {
        ofs << line << "\n";
    }

    return 0;
}